

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLtesting.c
# Opt level: O2

char ** RDL_calculate_pairwise_family
                  (char **cycle_array,uint nof_rings,uint nof_bonds,_func_int_void_ptr *stop)

{
  size_t __size;
  char *bitset;
  char *bitset_00;
  char *bitset_01;
  int iVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  char **ppcVar5;
  ulong uVar6;
  void *__dest;
  char **current_rings;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (nof_rings < 0xffff) {
    uVar11 = (ulong)nof_rings;
    pvVar4 = calloc(1,uVar11 * uVar11);
    uVar9 = 0;
    if (pvVar4 != (void *)0x0) {
      __size = uVar11 * 8;
      ppcVar5 = (char **)malloc(__size);
      for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
        ppcVar5[uVar6] = (char *)(uVar9 + (long)pvVar4);
        uVar9 = (ulong)((int)uVar9 + nof_rings);
      }
      pvVar4 = malloc(__size);
      uVar9 = (ulong)nof_bonds;
      for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
        __dest = malloc(uVar9);
        *(void **)((long)pvVar4 + uVar6 * 8) = __dest;
        memcpy(__dest,cycle_array[uVar6],uVar9);
      }
      current_rings = (char **)malloc(__size);
      uVar6 = 0;
      while ((uVar8 = uVar6, uVar8 != uVar11 && (iVar1 = (*stop)((void *)0x0), iVar1 == 0))) {
        uVar6 = uVar8 + 1;
        uVar12 = uVar6 & 0xffffffff;
        while (((uint)uVar12 < nof_rings && (iVar1 = (*stop)((void *)0x0), iVar1 == 0))) {
          bitset = *(char **)((long)pvVar4 + uVar8 * 8);
          bitset_00 = *(char **)((long)pvVar4 + uVar12 * 8);
          uVar2 = RDL_count_bonds(bitset,nof_bonds);
          uVar3 = RDL_count_bonds(bitset_00,nof_bonds);
          if (uVar2 == uVar3) {
            iVar1 = 0;
            for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
              if (bitset[uVar7] != '\0') {
                iVar1 = (iVar1 + 1) - (uint)(bitset_00[uVar7] == '\0');
              }
            }
            if (iVar1 != 0) {
              uVar7 = 0;
              for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
                bitset_01 = *(char **)((long)pvVar4 + uVar10 * 8);
                uVar3 = RDL_count_bonds(bitset_01,nof_bonds);
                if (uVar3 < uVar2) {
                  current_rings[uVar7] = bitset_01;
                  uVar7 = (ulong)((uint)uVar7 + 1);
                }
              }
              iVar1 = RDL_check_property3(bitset,nof_bonds,bitset_00,current_rings,(uint)uVar7,0,
                                          stop);
              ppcVar5[uVar8][uVar12] = (char)iVar1;
              ppcVar5[uVar12][uVar8] = (char)iVar1;
            }
          }
          uVar12 = (ulong)((uint)uVar12 + 1);
        }
      }
      for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
        free(*(void **)((long)pvVar4 + uVar9 * 8));
      }
      free(pvVar4);
      free(current_rings);
      return ppcVar5;
    }
  }
  return (char **)0x0;
}

Assistant:

char** RDL_calculate_pairwise_family(const char** cycle_array,
                                  unsigned nof_rings,
                                  unsigned nof_bonds,
                                  int (*stop) (const void*))
{
  char* family_relation_data;
  char **family_relation, **ring_sets;
  const char **rings;
  const char *ring1, *ring2, *ring;
  unsigned i, j, k, ring1_count, ring2_count, intersection_count,
    ringcounter, ridx, ring_count;

  size_t matrix_size = nof_rings;

  if (nof_rings >= sqrt(UINT_MAX) - 1) {
    return NULL;
  }

  matrix_size *= nof_rings;

  /* first establish pairwise URF-relations */
  family_relation_data = malloc(matrix_size * sizeof(*family_relation_data));

  /* too much memory requested */
  if (!family_relation_data) {
    return NULL;
  }

  memset(family_relation_data, 0, matrix_size * sizeof(*family_relation_data));
  family_relation = malloc(nof_rings * sizeof(*family_relation));

  for (i = 0; i < nof_rings; ++i) {
    family_relation[i] = family_relation_data + i * nof_rings;
  }

  ring_sets = malloc(nof_rings * sizeof(*ring_sets));

  for (i = 0; i < nof_rings; ++i) {
    ring_sets[i] = malloc(nof_bonds * sizeof(**ring_sets));
    memcpy(ring_sets[i], cycle_array[i], nof_bonds);
  }

  rings = malloc(nof_rings * sizeof(*rings));

  for (i = 0; i < nof_rings && !stop(NULL); ++i) {
    for (j = i+1; j < nof_rings && !stop(NULL); ++j) {
      ring1 = ring_sets[i];
      ring2 = ring_sets[j];
      /* check property 1: |C1| == |C2| */
      ring1_count = RDL_count_bonds(ring1, nof_bonds);
      ring2_count = RDL_count_bonds(ring2, nof_bonds);
      if (ring1_count != ring2_count) {
        continue;
      }
      /* check property 2: C1 ^ C2 != o */
      intersection_count = 0;
      for (k = 0; k < nof_bonds; ++k) {
        if (ring1[k] && ring2[k]) {
          ++intersection_count;
        }
      }
      if (intersection_count == 0) {
        continue;
      }

      /*
       * check property 3: exists any subset of strictly smaller rings,
       * so the symmetric difference of ring 1 and a subset of
       * those smaller rings equals ring 2
       */
      ringcounter = 0;
      for(ridx = 0; ridx < nof_rings; ++ridx) {
        ring = ring_sets[ridx];
        ring_count = RDL_count_bonds(ring, nof_bonds);
        if (ring_count < ring1_count) {
          rings[ringcounter] = ring;
          ++ringcounter;
        }
      }

      family_relation[i][j] = RDL_check_property3(
          ring1, nof_bonds, ring2, rings, ringcounter, 0, stop);
      family_relation[j][i] = family_relation[i][j];
    }
  }

  for (i = 0; i < nof_rings; ++i) {
    free(ring_sets[i]);
  }

  free(ring_sets);
  free((void*)rings);

  return family_relation;
}